

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_test(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue JVar1;
  JSValue r;
  int iVar2;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSValue JVar3;
  BOOL ret;
  JSValue val;
  JSValueUnion ctx_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int64_t iVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_c;
  
  r.tag._0_4_ = in_stack_ffffffffffffffe0;
  r.u = (JSValueUnion)in_stack_ffffffffffffffd8;
  r.tag._4_4_ = in_stack_ffffffffffffffe4;
  JVar3.tag._0_4_ = in_stack_ffffffffffffffd0;
  JVar3.u = (JSValueUnion)in_RDX;
  JVar3.tag._4_4_ = in_stack_ffffffffffffffd4;
  JVar3 = JS_RegExpExec(in_RSI,r,JVar3);
  ctx_00 = JVar3.u;
  iVar5 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    iVar2 = JS_IsNull(JVar3);
    uVar4 = (uint)(iVar2 == 0);
    v.tag._0_4_ = in_stack_ffffffffffffff90;
    v.u = (JSValueUnion)iVar5;
    v.tag._4_1_ = iVar2 == 0;
    v.tag._5_3_ = 0;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
    uVar4 = (uint)(uVar4 != 0);
    iVar5 = 1;
    in_stack_ffffffffffffffd4 = uStack_c;
  }
  else {
    uVar4 = 0;
    iVar5 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = iVar5;
  return JVar1;
}

Assistant:

static JSValue js_regexp_test(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValue val;
    BOOL ret;

    val = JS_RegExpExec(ctx, this_val, argv[0]);
    if (JS_IsException(val))
        return JS_EXCEPTION;
    ret = !JS_IsNull(val);
    JS_FreeValue(ctx, val);
    return JS_NewBool(ctx, ret);
}